

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O2

void nng_http_handler_collect_body(nng_http_handler *h,_Bool want,size_t len)

{
  nni_http_handler_collect_body(h,want,len);
  return;
}

Assistant:

void
nng_http_handler_collect_body(nng_http_handler *h, bool want, size_t len)
{
#ifdef NNG_SUPP_HTTP
	nni_http_handler_collect_body(h, want, len);
#else
	NNI_ARG_UNUSED(h);
	NNI_ARG_UNUSED(want);
	NNI_ARG_UNUSED(len);
#endif
}